

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void cram_ref_incr(refs_t *r,int id)

{
  int id_local;
  refs_t *r_local;
  
  pthread_mutex_lock((pthread_mutex_t *)&r->lock);
  cram_ref_incr_locked(r,id);
  pthread_mutex_unlock((pthread_mutex_t *)&r->lock);
  return;
}

Assistant:

void cram_ref_incr(refs_t *r, int id) {
    pthread_mutex_lock(&r->lock);
    cram_ref_incr_locked(r, id);
    pthread_mutex_unlock(&r->lock);
}